

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remote_server.cpp
# Opt level: O2

void OpenHandler(CManager cm,CMConnection conn,void *vevent,void *client_data,attr_list attrs)

{
  ostream *poVar1;
  AnonADIOSFile *this;
  mapped_type *ppAVar2;
  key_type local_80;
  CMConnection conn_local;
  string strMode;
  string local_50;
  ulong local_30;
  int64_t local_28;
  
  conn_local = conn;
  std::__cxx11::string::string((string *)&strMode,"Streaming",(allocator *)&local_80);
  if (*(int *)((long)vevent + 0x10) == 1) {
    std::__cxx11::string::assign((char *)&strMode);
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"Got an open request (mode ");
  poVar1 = std::operator<<(poVar1,(string *)&strMode);
  poVar1 = std::operator<<(poVar1,") for file ");
  poVar1 = std::operator<<(poVar1,*(char **)((long)vevent + 8));
  std::endl<char,std::char_traits<char>>(poVar1);
  this = (AnonADIOSFile *)operator_new(0x78);
  std::__cxx11::string::string
            ((string *)&local_50,*(char **)((long)vevent + 8),(allocator *)&local_80);
  AnonADIOSFile::AnonADIOSFile
            (this,&local_50,*(RemoteFileMode *)((long)vevent + 0x10),
             *(int *)((long)vevent + 0x14) != 0);
  std::__cxx11::string::~string((string *)&local_50);
  local_28 = this->m_ID;
  local_30 = (ulong)*vevent;
  CMwrite(conn,*(undefined8 *)((long)client_data + 0x18));
  CMconn_register_close_handler(conn,ConnCloseHandler,0);
  local_80 = this->m_ID;
  ppAVar2 = std::__detail::
            _Map_base<unsigned_long,_std::pair<const_unsigned_long,_AnonADIOSFile_*>,_std::allocator<std::pair<const_unsigned_long,_AnonADIOSFile_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_AnonADIOSFile_*>,_std::allocator<std::pair<const_unsigned_long,_AnonADIOSFile_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&ADIOSFileMap,&local_80);
  *ppAVar2 = this;
  std::
  _Hashtable<void*,std::pair<void*const,unsigned_long>,std::allocator<std::pair<void*const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<void*>,std::hash<void*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
  ::_M_emplace<_CMConnection*&,long&>
            ((_Hashtable<void*,std::pair<void*const,unsigned_long>,std::allocator<std::pair<void*const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<void*>,std::hash<void*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
              *)&ConnToFileMap,&conn_local,&this->m_ID);
  ADIOSFilesOpened = ADIOSFilesOpened + 1;
  last_service_time.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  std::__cxx11::string::~string((string *)&strMode);
  return;
}

Assistant:

static void OpenHandler(CManager cm, CMConnection conn, void *vevent, void *client_data,
                        attr_list attrs)
{
    OpenFileMsg open_msg = static_cast<OpenFileMsg>(vevent);
    struct Remote_evpath_state *ev_state = static_cast<struct Remote_evpath_state *>(client_data);
    _OpenResponseMsg open_response_msg;
    std::string strMode = "Streaming";
    if (open_msg->Mode == RemoteOpenRandomAccess)
        strMode = "RandomAccess";
    std::cout << "Got an open request (mode " << strMode << ") for file " << open_msg->FileName
              << std::endl;
    AnonADIOSFile *f =
        new AnonADIOSFile(open_msg->FileName, open_msg->Mode, open_msg->RowMajorOrder);
    memset(&open_response_msg, 0, sizeof(open_response_msg));
    open_response_msg.FileHandle = f->m_ID;
    open_response_msg.OpenResponseCondition = open_msg->OpenResponseCondition;
    CMwrite(conn, ev_state->OpenResponseFormat, &open_response_msg);
    CMconn_register_close_handler(conn, ConnCloseHandler, NULL);
    ADIOSFileMap[f->m_ID] = f;
    ConnToFileMap.emplace(conn, f->m_ID);
    ADIOSFilesOpened++;
    last_service_time = std::chrono::steady_clock::now();
}